

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O3

int mbedtls_pk_sign(mbedtls_pk_context *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,
                   uchar *sig,size_t *sig_len,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng
                   )

{
  byte bVar1;
  int iVar2;
  mbedtls_md_info_t *md_info;
  mbedtls_pk_info_t *pmVar3;
  
  iVar2 = -16000;
  if ((ctx != (mbedtls_pk_context *)0x0) &&
     (pmVar3 = ctx->pk_info, pmVar3 != (mbedtls_pk_info_t *)0x0)) {
    if (hash_len == 0) {
      md_info = mbedtls_md_info_from_type(md_alg);
      if (md_info == (mbedtls_md_info_t *)0x0) {
        return -16000;
      }
      bVar1 = mbedtls_md_get_size(md_info);
      hash_len = (size_t)bVar1;
      pmVar3 = ctx->pk_info;
    }
    if (pmVar3->sign_func !=
        (_func_int_void_ptr_mbedtls_md_type_t_uchar_ptr_size_t_uchar_ptr_size_t_ptr__func_int_void_ptr_uchar_ptr_size_t_ptr_void_ptr
         *)0x0) {
      iVar2 = (*pmVar3->sign_func)(ctx->pk_ctx,md_alg,hash,hash_len,sig,sig_len,f_rng,p_rng);
      return iVar2;
    }
    iVar2 = -0x3f00;
  }
  return iVar2;
}

Assistant:

int mbedtls_pk_sign( mbedtls_pk_context *ctx, mbedtls_md_type_t md_alg,
             const unsigned char *hash, size_t hash_len,
             unsigned char *sig, size_t *sig_len,
             int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    if( ctx == NULL || ctx->pk_info == NULL ||
        pk_hashlen_helper( md_alg, &hash_len ) != 0 )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    if( ctx->pk_info->sign_func == NULL )
        return( MBEDTLS_ERR_PK_TYPE_MISMATCH );

    return( ctx->pk_info->sign_func( ctx->pk_ctx, md_alg, hash, hash_len,
                                     sig, sig_len, f_rng, p_rng ) );
}